

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::RoundLog2(int x,int tile_rounding_mode)

{
  undefined4 local_14;
  int tile_rounding_mode_local;
  int x_local;
  
  if (tile_rounding_mode == 0) {
    local_14 = FloorLog2(x);
  }
  else {
    local_14 = CeilLog2(x);
  }
  return local_14;
}

Assistant:

static int RoundLog2(int x, int tile_rounding_mode) {
  return (tile_rounding_mode == TINYEXR_TILE_ROUND_DOWN) ? FloorLog2(static_cast<unsigned>(x)) : CeilLog2(static_cast<unsigned>(x));
}